

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall
Lowerer::LowerScopedLdFld
          (Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,bool withInlineCache)

{
  LowererMD *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  JITTimeFunctionBody *this_01;
  intptr_t address;
  AddrOpnd *opndArg;
  Instr *pIVar4;
  SymOpnd *this_02;
  undefined4 *puVar5;
  PropertySymOpnd *pPVar6;
  IntConstOpnd *opndArg_00;
  Opnd *pOVar7;
  undefined7 in_register_00000009;
  Lowerer *this_03;
  
  if ((int)CONCAT71(in_register_00000009,withInlineCache) == 0) {
    LoadScriptContext(this,ldFldInstr);
  }
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  address = JITTimeFunctionBody::GetRootObject(this_01);
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,this->m_func,true,(Var)0x0);
  this_00 = &this->m_lowererMD;
  pIVar4 = LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg->super_Opnd);
  this_02 = (SymOpnd *)IR::Instr::UnlinkSrc1(ldFldInstr);
  OVar2 = IR::Opnd::GetKind((Opnd *)this_02);
  if (OVar2 == OpndKindSym) {
    OVar2 = IR::Opnd::GetKind((Opnd *)this_02);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_0059b329;
      *puVar5 = 0;
    }
    if (this_02->m_sym->m_kind != SymKindProperty) goto LAB_0059b151;
  }
  else {
LAB_0059b151:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1af2,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar3) goto LAB_0059b329;
    *puVar5 = 0;
  }
  LoadPropertySymAsArgument(this,ldFldInstr,(Opnd *)this_02);
  if (withInlineCache) {
    OVar2 = IR::Opnd::GetKind((Opnd *)this_02);
    if (OVar2 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_0059b329;
      *puVar5 = 0;
    }
    bVar3 = IR::SymOpnd::IsPropertySymOpnd(this_02);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1af7,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar3) {
LAB_0059b329:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    pPVar6 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_02);
    opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar6->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg_00->super_Opnd);
    pPVar6 = IR::Opnd::AsPropertySymOpnd((Opnd *)this_02);
    pOVar7 = LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar6,false);
    this_03 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar7);
    pOVar7 = LoadFunctionBodyOpnd(this_03,ldFldInstr);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar7);
  }
  LowererMD::ChangeToHelperCall
            (this_00,ldFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar4;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedLdFld(IR::Instr * ldFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache)
{
    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    if(!withInlineCache)
    {
        LoadScriptContext(ldFldInstr);
    }

    intptr_t rootObject = m_func->GetJITFunctionBody()->GetRootObject();
    src = IR::AddrOpnd::New(rootObject, IR::AddrOpndKindDynamicVar, this->m_func, true);
    instrPrev = m_lowererMD.LoadHelperArgument(ldFldInstr, src);

    src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");
    this->LoadPropertySymAsArgument(ldFldInstr, src);

    if (withInlineCache)
    {
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod);

    return instrPrev;
}